

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlHeader(IMkvWriter *writer,uint64_t doc_type_version,char *doc_type)

{
  bool bVar1;
  uint64 uVar2;
  uint64 uVar3;
  long lVar4;
  char *value;
  IMkvWriter *in_RDX;
  IMkvWriter *in_RSI;
  uint64_t size;
  uint64 in_stack_ffffffffffffffd8;
  undefined1 local_1;
  
  uVar2 = EbmlElementSize((uint64)in_RDX,in_stack_ffffffffffffffd8);
  uVar3 = EbmlElementSize((uint64)in_RDX,uVar2);
  uVar3 = uVar3 + uVar2;
  uVar2 = EbmlElementSize((uint64)in_RDX,uVar3);
  uVar2 = uVar2 + uVar3;
  uVar3 = EbmlElementSize((uint64)in_RDX,uVar2);
  lVar4 = uVar3 + uVar2;
  uVar2 = EbmlElementSize((uint64)in_RSI,(char *)in_RDX);
  uVar2 = uVar2 + lVar4;
  uVar3 = EbmlElementSize((uint64)in_RDX,uVar2);
  uVar3 = uVar3 + uVar2;
  uVar2 = EbmlElementSize((uint64)in_RDX,uVar3);
  value = (char *)(uVar2 + uVar3);
  bVar1 = WriteEbmlMasterElement(in_RSI,(uint64)in_RDX,(uint64)value);
  if (bVar1) {
    bVar1 = WriteEbmlElement(in_RDX,(uint64)value,0x1703c5);
    if (bVar1) {
      bVar1 = WriteEbmlElement(in_RDX,(uint64)value,0x1703e7);
      if (bVar1) {
        bVar1 = WriteEbmlElement(in_RDX,(uint64)value,0x170409);
        if (bVar1) {
          bVar1 = WriteEbmlElement(in_RDX,(uint64)value,0x17042b);
          if (bVar1) {
            bVar1 = WriteEbmlElement(in_RSI,(uint64)in_RDX,value);
            if (bVar1) {
              bVar1 = WriteEbmlElement(in_RDX,(uint64)value,0x170469);
              if (bVar1) {
                bVar1 = WriteEbmlElement(in_RDX,(uint64)value,0x170488);
                if (bVar1) {
                  local_1 = true;
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool WriteEbmlHeader(IMkvWriter* writer, uint64_t doc_type_version,
                     const char* const doc_type) {
  // Level 0
  uint64_t size =
      EbmlElementSize(libwebm::kMkvEBMLVersion, static_cast<uint64>(1));
  size += EbmlElementSize(libwebm::kMkvEBMLReadVersion, static_cast<uint64>(1));
  size += EbmlElementSize(libwebm::kMkvEBMLMaxIDLength, static_cast<uint64>(4));
  size +=
      EbmlElementSize(libwebm::kMkvEBMLMaxSizeLength, static_cast<uint64>(8));
  size += EbmlElementSize(libwebm::kMkvDocType, doc_type);
  size += EbmlElementSize(libwebm::kMkvDocTypeVersion,
                          static_cast<uint64>(doc_type_version));
  size +=
      EbmlElementSize(libwebm::kMkvDocTypeReadVersion, static_cast<uint64>(2));

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvEBML, size))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvEBMLVersion,
                        static_cast<uint64>(1))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvEBMLReadVersion,
                        static_cast<uint64>(1))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvEBMLMaxIDLength,
                        static_cast<uint64>(4))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvEBMLMaxSizeLength,
                        static_cast<uint64>(8))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvDocType, doc_type))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvDocTypeVersion,
                        static_cast<uint64>(doc_type_version))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvDocTypeReadVersion,
                        static_cast<uint64>(2))) {
    return false;
  }

  return true;
}